

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_write_disk_lookup.c
# Opt level: O0

int64_t user_lookup(void *d,char *name,int64_t u)

{
  int iVar1;
  undefined8 in_RDX;
  char *in_RSI;
  longlong in_RDI;
  void *unaff_retaddr;
  int *mp;
  char *in_stack_ffffffffffffffd0;
  int64_t local_8;
  
  assertion_equal_int(in_RSI,(wchar_t)((ulong)in_RDX >> 0x20),in_RDI,in_stack_ffffffffffffffd0,0,
                      (char *)0x1cf664,unaff_retaddr);
  iVar1 = strcmp("FOO",in_RSI);
  if (iVar1 == 0) {
    local_8 = 2;
  }
  else {
    local_8 = 0x4a;
  }
  return local_8;
}

Assistant:

static int64_t
user_lookup(void *d, const char *name, int64_t u)
{
	int *mp = d;

	(void)u; /* UNUSED */

	assertEqualInt(*mp, 0x1234);
	if (strcmp("FOO", name) == 0)
		return (2);
	return (74);
}